

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::utility::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,delim_str *d)

{
  bool bVar1;
  size_t sVar2;
  long *plVar3;
  long *in_RSI;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_RDI;
  bool bVar4;
  size_t i;
  size_t len;
  wchar_t c;
  undefined8 local_28;
  
  sVar2 = strlen((char *)*in_RSI);
  local_28 = 0;
  while( true ) {
    bVar4 = false;
    if (local_28 < sVar2) {
      plVar3 = (long *)std::wistream::get((wchar_t *)in_RDI);
      bVar1 = std::wios::operator_cast_to_bool((wios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
      bVar4 = false;
      if (bVar1) {
        bVar4 = *(char *)(*in_RSI + local_28) != '\0';
      }
      bVar4 = (bool)(bVar4 ^ 1);
    }
    if (!bVar4) break;
    local_28 = local_28 + 1;
  }
  if (local_28 < sVar2) {
    std::wios::setstate((int)in_RDI + (int)*(undefined8 *)(*(long *)in_RDI + -0x18));
  }
  return in_RDI;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, const delim_str &d) {
        char_t c{0};
        std::size_t len{std::strlen(d.str)}, i{0};
        while (i < len and not(in.get(c) and c != d.str[i])) {
          ++i;
        }
        if (i < len)
          in.setstate(std::ios::failbit);
        return in;
      }